

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_bin_ugrid_int(FILE *file,REF_BOOL swap,REF_BOOL fat,REF_INT output)

{
  ulong uVar1;
  size_t sVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *pcVar5;
  uint local_c;
  ulong local_8;
  
  uVar1 = (ulong)(uint)output;
  if (fat == 0) {
    local_c = (uint)output >> 0x18 | (output & 0xff0000U) >> 8 | (output & 0xff00U) << 8 |
              output << 0x18;
    if (swap == 0) {
      local_c = output;
    }
    sVar2 = fwrite(&local_c,4,1,(FILE *)file);
    if (sVar2 == 1) {
      return 0;
    }
    pcVar5 = "output int";
    uVar3 = 0x616;
  }
  else {
    local_8 = (ulong)output;
    if (swap != 0) {
      uVar4 = 0xff000000;
      if (-1 < output) {
        uVar4 = 0;
      }
      local_8 = (ulong)((uint)(output >> 0x1f) >> 8 & 0xff00) |
                (ulong)((int)(char)((uint)output >> 0x18) & 0xff0000) |
                uVar4 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                        (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38 | local_8 >> 0x38;
    }
    sVar2 = fwrite(&local_8,8,1,(FILE *)file);
    if (sVar2 == 1) {
      return 0;
    }
    pcVar5 = "output long";
    uVar3 = 0x611;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar3,
         "ref_export_bin_ugrid_int",pcVar5,1,sVar2);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_export_bin_ugrid_int(FILE *file, REF_BOOL swap,
                                                   REF_BOOL fat,
                                                   REF_INT output) {
  if (fat) {
    REF_LONG actual;
    actual = (REF_LONG)output;
    if (swap) SWAP_LONG(actual);
    REIS(1, fwrite(&actual, sizeof(REF_LONG), 1, file), "output long");
  } else {
    REF_INT actual;
    actual = output;
    if (swap) SWAP_INT(actual);
    REIS(1, fwrite(&actual, sizeof(REF_INT), 1, file), "output int");
  }
  return REF_SUCCESS;
}